

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

lego_port * __thiscall ev3dev::lego_port::set_set_device(lego_port *this,string *v)

{
  lego_port *in_RDX;
  lego_port *in_RDI;
  device *in_stack_00000070;
  lego_port *this_00;
  allocator local_39;
  string local_38 [56];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"set_device",&local_39);
  device::set_attr_string(in_stack_00000070,(string *)this,v);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lego_port(this_00,in_RDX);
  return in_RDI;
}

Assistant:

lego_port set_set_device(std::string v) {
            set_attr_string("set_device", v);
            return *this;
        }